

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O0

void Cmd_testcolor(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  int iVar2;
  FString *this;
  char *pcVar3;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_4c;
  FString local_48 [3];
  int local_30;
  uint32 local_2c;
  int desaturate;
  DWORD color;
  FString colorstring;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  colorstring.Chars._4_4_ = key;
  FString::FString((FString *)&desaturate);
  iVar2 = FCommandLine::argc(argv);
  if (iVar2 < 2) {
    Printf("testcolor <color> [desaturation]\n");
  }
  else {
    FCommandLine::operator[](argv,1);
    V_GetColorStringByName((char *)local_48);
    this = FString::operator=((FString *)&desaturate,local_48);
    bVar1 = FString::IsEmpty(this);
    FString::~FString(local_48);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pcVar3 = FCommandLine::operator[](argv,1);
      local_2c = V_GetColorFromString((DWORD *)0x0,pcVar3);
    }
    else {
      pcVar3 = FString::operator_cast_to_char_((FString *)&desaturate);
      local_2c = V_GetColorFromString((DWORD *)0x0,pcVar3);
    }
    iVar2 = FCommandLine::argc(argv);
    if (iVar2 < 3) {
      local_30 = NormalLight.Desaturate;
    }
    else {
      pcVar3 = FCommandLine::operator[](argv,2);
      local_30 = atoi(pcVar3);
    }
    PalEntry::PalEntry((PalEntry *)&local_4c.field_0,local_2c);
    FDynamicColormap::ChangeColor(&NormalLight,(PalEntry)local_4c,local_30);
  }
  FString::~FString((FString *)&desaturate);
  return;
}

Assistant:

CCMD (testcolor)
{
	FString colorstring;
	DWORD color;
	int desaturate;

	if (argv.argc() < 2)
	{
		Printf ("testcolor <color> [desaturation]\n");
	}
	else
	{
		if ( !(colorstring = V_GetColorStringByName (argv[1])).IsEmpty() )
		{
			color = V_GetColorFromString (NULL, colorstring);
		}
		else
		{
			color = V_GetColorFromString (NULL, argv[1]);
		}
		if (argv.argc() > 2)
		{
			desaturate = atoi (argv[2]);
		}
		else
		{
			desaturate = NormalLight.Desaturate;
		}
		NormalLight.ChangeColor (color, desaturate);
	}
}